

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_lambda.cpp
# Opt level: O2

idx_t duckdb::GetLambdaParamIndex
                (vector<duckdb::DummyBinding,_true> *lambda_bindings,
                BoundLambdaExpression *bound_lambda_expr,
                BoundLambdaRefExpression *bound_lambda_ref_expr)

{
  const_reference pvVar1;
  idx_t __n;
  long lVar2;
  
  __n = bound_lambda_ref_expr->lambda_idx;
  lVar2 = 0;
  while (__n = __n + 1,
        __n < (ulong)(((long)(lambda_bindings->
                             super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                             ).
                             super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(lambda_bindings->
                            super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                            ).
                            super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x108)) {
    pvVar1 = vector<duckdb::DummyBinding,_true>::get<true>(lambda_bindings,__n);
    lVar2 = lVar2 + ((long)(pvVar1->super_Binding).names.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar1->super_Binding).names.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
  }
  pvVar1 = vector<duckdb::DummyBinding,_true>::get<true>
                     (lambda_bindings,bound_lambda_ref_expr->lambda_idx);
  return lVar2 + ~(bound_lambda_ref_expr->binding).column_index + bound_lambda_expr->parameter_count
         + ((long)(pvVar1->super_Binding).names.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar1->super_Binding).names.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
}

Assistant:

idx_t GetLambdaParamIndex(const vector<DummyBinding> &lambda_bindings, const BoundLambdaExpression &bound_lambda_expr,
                          const BoundLambdaRefExpression &bound_lambda_ref_expr) {
	D_ASSERT(bound_lambda_ref_expr.lambda_idx < lambda_bindings.size());
	idx_t offset = 0;
	// count the remaining lambda parameters BEFORE the current lambda parameter,
	// as these will be in front of the current lambda parameter in the input chunk
	for (idx_t i = bound_lambda_ref_expr.lambda_idx + 1; i < lambda_bindings.size(); i++) {
		offset += lambda_bindings[i].names.size();
	}
	offset +=
	    lambda_bindings[bound_lambda_ref_expr.lambda_idx].names.size() - bound_lambda_ref_expr.binding.column_index - 1;
	offset += bound_lambda_expr.parameter_count;
	return offset;
}